

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Pointer MA_get_mbase(Integer datatype)

{
  char *in_RDI;
  ErrorType unaff_retaddr;
  ErrorLevel unaff_retaddr_00;
  char *in_stack_fffffffffffffff8;
  Pointer pcVar1;
  
  ma_stats.calls[6] = ma_stats.calls[6] + 1;
  ma_preinitialize((char *)0x1ad2c7);
  if (((long)in_RDI < 1000) || (0x3f8 < (long)in_RDI)) {
    sprintf(ma_ebuf,"invalid datatype: %ld",in_RDI);
    ma_error(unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI);
    pcVar1 = (Pointer)0x0;
  }
  else {
    pcVar1 = ma_base[(long)(in_RDI + -1000)];
  }
  return pcVar1;
}

Assistant:

public Pointer MA_get_mbase(Integer datatype)    /* to get base address of */
{
#ifdef STATS
    ma_stats.calls[(int)FID_MA_get_mbase]++;
#endif /* STATS */

    /* preinitialize if necessary */
    ma_preinitialize("MA_get_mbase");

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype);
        ma_error(EL_Fatal, ET_External, "MA_get_mbase", ma_ebuf);
        return NULL;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    return ma_base[datatype];
}